

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::Threads(BenchmarkImp *this,int t)

{
  CheckHandler local_20;
  int local_14;
  BenchmarkImp *pBStack_10;
  int t_local;
  BenchmarkImp *this_local;
  
  local_14 = t;
  pBStack_10 = this;
  if (0 < t) {
    GetNullLogInstance();
    std::vector<int,_std::allocator<int>_>::push_back(&this->thread_counts_,&local_14);
    return;
  }
  CheckHandler::CheckHandler
            (&local_20,"(t) > (0)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
             ,"Threads",0x1d9);
  CheckHandler::GetLog(&local_20);
  CheckHandler::~CheckHandler(&local_20);
}

Assistant:

void BenchmarkImp::Threads(int t) {
  CHECK_GT(t, 0);
  thread_counts_.push_back(t);
}